

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_send_eof(LIBSSH2_CHANNEL *channel)

{
  int iVar1;
  uchar local_25;
  int rc;
  LIBSSH2_SESSION *pLStack_20;
  uchar packet [5];
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel_local;
  
  pLStack_20 = channel->session;
  local_25 = '`';
  _libssh2_htonu32((uchar *)&rc,(channel->remote).id);
  iVar1 = _libssh2_transport_send(pLStack_20,&local_25,5,(uchar *)0x0,0);
  if (iVar1 == -0x25) {
    _libssh2_error(pLStack_20,-0x25,"Would block sending EOF");
    channel_local._4_4_ = -0x25;
  }
  else if (iVar1 == 0) {
    (channel->local).eof = '\x01';
    channel_local._4_4_ = 0;
  }
  else {
    channel_local._4_4_ = _libssh2_error(pLStack_20,-7,"Unable to send EOF on channel");
  }
  return channel_local._4_4_;
}

Assistant:

static int channel_send_eof(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char packet[5];    /* packet_type(1) + channelno(4) */
    int rc;

    _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                   "Sending EOF on channel %u/%u",
                   channel->local.id, channel->remote.id));
    packet[0] = SSH_MSG_CHANNEL_EOF;
    _libssh2_htonu32(packet + 1, channel->remote.id);
    rc = _libssh2_transport_send(session, packet, 5, NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(session, rc,
                       "Would block sending EOF");
        return rc;
    }
    else if(rc) {
        return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                              "Unable to send EOF on channel");
    }
    channel->local.eof = 1;

    return 0;
}